

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void xmlExpandPEsInEntityValue(xmlParserCtxtPtr ctxt,xmlSBuf *buf,xmlChar *str,int length,int depth)

{
  byte *pbVar1;
  byte bVar2;
  xmlEntityType xVar3;
  getParameterEntitySAXFunc p_Var4;
  xmlEntityPtr pxVar5;
  int iVar6;
  uint uVar7;
  xmlEntityPtr pxVar8;
  xmlParserInputPtr pxVar9;
  xmlParserInputPtr *ppxVar10;
  size_t sVar11;
  xmlChar *pxVar12;
  uint uVar13;
  xmlParserErrors code;
  byte *pbVar14;
  ulong uVar15;
  unsigned_long uVar16;
  xmlChar *in_stack_ffffffffffffff68;
  char *pcVar17;
  byte *local_88;
  byte *local_80;
  xmlChar *local_78;
  size_t local_70;
  byte *local_68;
  xmlParserInputPtr *local_60;
  xmlParserInputPtr local_58;
  xmlChar *local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  if (str != (xmlChar *)0x0) {
    iVar6 = 0x28;
    if ((ctxt->options & 0x80000) == 0) {
      iVar6 = 0x14;
    }
    local_88 = str;
    if (depth < iVar6) {
      if (0 < length) {
        pbVar14 = str + length;
        local_68 = pbVar14;
        do {
          if (1 < ctxt->disableSAX) break;
          bVar2 = *local_88;
          iVar6 = (int)str;
          if ((char)bVar2 < '\0') {
            uVar7 = xmlUTF8MultibyteLen(ctxt,local_88,"invalid character in entity value\n");
            if (uVar7 == 0) {
LAB_00131e06:
              if (str < local_88) {
                xmlSBufAddString(buf,str,(int)local_88 - iVar6);
              }
              xmlSBufAddString(buf,(xmlChar *)anon_var_dwarf_11e17,3);
              local_88 = local_88 + 1;
              str = local_88;
            }
            else {
              local_88 = local_88 + uVar7;
            }
          }
          else {
            uVar7 = (uint)bVar2;
            if (uVar7 == 0x25) {
              if ((str < local_88) &&
                 (xmlSBufAddString(buf,str,(int)local_88 - iVar6), local_88 == (byte *)0x0)) {
                return;
              }
              if (*local_88 != 0x25) {
                return;
              }
              local_80 = local_88 + 1;
              pxVar12 = xmlParseStringName(ctxt,&local_80);
              pbVar14 = local_80;
              if (pxVar12 == (xmlChar *)0x0) {
                pcVar17 = "xmlParseStringPEReference: no name\n";
                code = XML_ERR_NAME_REQUIRED;
                goto LAB_00132004;
              }
              if (*local_80 != 0x3b) {
                xmlFatalErr(ctxt,XML_ERR_ENTITYREF_SEMICOL_MISSING,(char *)0x0);
LAB_001320b8:
                (*xmlFree)(pxVar12);
                return;
              }
              ctxt->hasPErefs = 1;
              if (((ctxt->sax == (_xmlSAXHandler *)0x0) ||
                  (p_Var4 = ctxt->sax->getParameterEntity, p_Var4 == (getParameterEntitySAXFunc)0x0)
                  ) || (pxVar8 = (*p_Var4)(ctxt->userData,pxVar12), pxVar8 == (xmlEntityPtr)0x0)) {
                xmlHandleUndeclaredEntity(ctxt,pxVar12);
                pxVar8 = (xmlEntityPtr)0x0;
              }
              else if ((pxVar8->etype & ~XML_INTERNAL_GENERAL_ENTITY) !=
                       XML_INTERNAL_PARAMETER_ENTITY) {
                in_stack_ffffffffffffff68 = pxVar12;
                xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_WAR_UNDECLARED_ENTITY,
                           XML_ERR_WARNING,pxVar12,(xmlChar *)0x0,(xmlChar *)0x0,0,
                           "%%%s; is not a parameter entity\n",pxVar12,0);
              }
              pbVar14 = pbVar14 + 1;
              (*xmlFree)(pxVar12);
              if (pxVar8 == (xmlEntityPtr)0x0) {
                return;
              }
              local_88 = pbVar14;
              if ((ctxt->inSubset != 2) &&
                 ((pxVar5 = ctxt->input->entity, pxVar5 == (xmlEntityPtr)0x0 ||
                  (pxVar5->etype != XML_EXTERNAL_PARAMETER_ENTITY)))) {
                xmlFatalErr(ctxt,XML_ERR_ENTITY_PE_INTERNAL,(char *)0x0);
                return;
              }
              if (pxVar8->content == (xmlChar *)0x0) {
                if (((ctxt->options & 0x800000) == 0) &&
                   ((ctxt->replaceEntities != 0 || (ctxt->validate != 0)))) {
                  xVar3 = pxVar8->etype;
                  if ((xVar3 == XML_EXTERNAL_GENERAL_PARSED_ENTITY) ||
                     (xVar3 == XML_EXTERNAL_PARAMETER_ENTITY)) {
                    pxVar9 = xmlLoadResource(ctxt,(char *)pxVar8->URI,(char *)pxVar8->ExternalID,
                                             (xVar3 == XML_EXTERNAL_PARAMETER_ENTITY) +
                                             XML_RESOURCE_GENERAL_ENTITY);
                    if (pxVar9 != (xmlParserInputPtr)0x0) {
                      local_50 = ctxt->encoding;
                      local_58 = ctxt->input;
                      local_48._0_4_ = ctxt->inputNr;
                      local_48._4_4_ = ctxt->inputMax;
                      uStack_40 = 0;
                      local_60 = ctxt->inputTab;
                      ctxt->input = (xmlParserInputPtr)0x0;
                      ctxt->inputNr = 0;
                      ctxt->inputMax = 1;
                      ctxt->encoding = (xmlChar *)0x0;
                      ppxVar10 = (xmlParserInputPtr *)(*xmlMalloc)(8);
                      ctxt->inputTab = ppxVar10;
                      if (ppxVar10 == (xmlParserInputPtr *)0x0) {
                        xmlCtxtErrMemory(ctxt);
LAB_00131e63:
                        xmlFreeInputStream(pxVar9);
                        pxVar12 = (xmlChar *)0x0;
                      }
                      else {
                        xmlBufResetInput(pxVar9->buf->buffer,pxVar9);
                        iVar6 = xmlCtxtPushInput(ctxt,pxVar9);
                        if (iVar6 < 0) goto LAB_00131e63;
                        xmlDetectEncoding(ctxt);
                        pxVar12 = ctxt->input->cur;
                        if (((((*pxVar12 == '<') && (pxVar12[1] == '?')) && (pxVar12[2] == 'x')) &&
                            ((pxVar12[3] == 'm' && (pxVar12[4] == 'l')))) &&
                           (((ulong)pxVar12[5] < 0x21 &&
                            ((0x100002600U >> ((ulong)pxVar12[5] & 0x3f) & 1) != 0)))) {
                          xmlParseTextDecl(ctxt);
                          iVar6 = xmlStrEqual(ctxt->version,"1.0");
                          if ((iVar6 != 0) &&
                             (iVar6 = xmlStrEqual(ctxt->input->version,"1.0"), iVar6 == 0)) {
                            in_stack_ffffffffffffff68 = (xmlChar *)0x0;
                            xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_VERSION_MISMATCH
                                       ,XML_ERR_FATAL,(xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,0
                                       ,"%s","Version mismatch between document and entity\n");
                          }
                        }
                        uVar15 = (long)pxVar9->cur - (long)pxVar9->base;
                        xmlBufShrink(pxVar9->buf->buffer,uVar15);
                        uVar16 = uVar15 + ctxt->sizeentities;
                        if (CARRY8(uVar15,ctxt->sizeentities)) {
                          uVar16 = 0xffffffffffffffff;
                        }
                        ctxt->sizeentities = uVar16;
                        do {
                          iVar6 = xmlParserInputBufferGrow(pxVar9->buf,0x1000);
                        } while (0 < iVar6);
                        xmlBufResetInput(pxVar9->buf->buffer,pxVar9);
                        if (iVar6 < 0) {
                          xmlCtxtErrIO(ctxt,pxVar9->buf->error,(char *)0x0);
LAB_00131e90:
                          pxVar12 = (xmlChar *)0x0;
                        }
                        else {
                          sVar11 = xmlBufUse(pxVar9->buf->buffer);
                          if ((sVar11 & 0xffffffff80000000) == 0) {
                            local_70 = sVar11;
                            pxVar12 = xmlBufContent(pxVar9->buf->buffer);
                            sVar11 = local_70;
                            pxVar12 = xmlStrndup(pxVar12,(int)local_70);
                            if (pxVar12 != (xmlChar *)0x0) {
                              if (sVar11 != 0) {
                                uVar15 = 0;
                                local_78 = pxVar12;
                                do {
                                  local_80 = (byte *)CONCAT44(local_80._4_4_,
                                                              (int)sVar11 - (int)uVar15);
                                  pbVar14 = local_78 + uVar15;
                                  uVar7 = xmlGetUTF8Char(pbVar14,(int *)&local_80);
                                  if ((int)uVar7 < 0) {
LAB_00131e98:
                                    uVar7 = (uint)*pbVar14;
                                    in_stack_ffffffffffffff68 =
                                         (xmlChar *)
                                         CONCAT44((int)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                                                  uVar7);
                                    xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,
                                               XML_ERR_INVALID_CHAR,XML_ERR_FATAL,(xmlChar *)0x0,
                                               (xmlChar *)0x0,(xmlChar *)0x0,uVar7,
                                               "xmlLoadEntityContent: invalid char value %d\n",
                                               in_stack_ffffffffffffff68);
                                    pxVar12 = local_78;
                                    goto LAB_00131f12;
                                  }
                                  if (uVar7 < 0x100) {
                                    if ((uVar7 < 0x20) &&
                                       ((0xd < uVar7 || ((0x2600U >> (uVar7 & 0x1f) & 1) == 0))))
                                    goto LAB_00131e98;
                                  }
                                  else if (0xfffff < uVar7 - 0x10000 &&
                                           (0x1ffd < uVar7 - 0xe000 && 0xd7ff < uVar7))
                                  goto LAB_00131e98;
                                  uVar15 = uVar15 + (long)(int)local_80;
                                  pxVar12 = local_78;
                                  sVar11 = local_70;
                                } while (uVar15 < local_70);
                              }
                              uVar16 = ctxt->sizeentities + sVar11;
                              if (CARRY8(ctxt->sizeentities,sVar11)) {
                                uVar16 = 0xffffffffffffffff;
                              }
                              ctxt->sizeentities = uVar16;
                              pxVar8->content = pxVar12;
                              pxVar8->length = (int)sVar11;
                              goto LAB_00131e90;
                            }
                          }
                          xmlCtxtErrMemory(ctxt);
                          pxVar12 = (xmlChar *)0x0;
                        }
                      }
LAB_00131f12:
                      while( true ) {
                        uVar7 = ctxt->inputNr;
                        if ((int)uVar7 < 1) break;
                        uVar13 = uVar7 - 1;
                        ctxt->inputNr = uVar13;
                        ppxVar10 = ctxt->inputTab;
                        if (uVar7 == 1) {
                          pxVar9 = (xmlParserInputPtr)0x0;
                        }
                        else {
                          pxVar9 = ppxVar10[(ulong)uVar7 - 2];
                        }
                        ctxt->input = pxVar9;
                        pxVar9 = ppxVar10[uVar13];
                        ppxVar10[uVar13] = (xmlParserInputPtr)0x0;
                        xmlFreeInputStream(pxVar9);
                      }
                      (*xmlFree)(ctxt->inputTab);
                      (*xmlFree)(ctxt->encoding);
                      ctxt->input = local_58;
                      ctxt->inputNr = (undefined4)local_48;
                      ctxt->inputMax = local_48._4_4_;
                      ctxt->inputTab = local_60;
                      ctxt->encoding = local_50;
                      (*xmlFree)(pxVar12);
                    }
                  }
                  else {
                    xmlFatalErr(ctxt,XML_ERR_ARGUMENT,"xmlLoadEntityContent parameter error");
                  }
                }
                else {
                  in_stack_ffffffffffffff68 = pxVar8->name;
                  xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_ENTITY_PROCESSING,
                             XML_ERR_WARNING,in_stack_ffffffffffffff68,(xmlChar *)0x0,(xmlChar *)0x0
                             ,0,"not validating will not read content for PE entity %s\n",
                             in_stack_ffffffffffffff68,0);
                }
              }
              iVar6 = xmlParserEntityCheck(ctxt,(long)pxVar8->length);
              if (iVar6 != 0) {
                return;
              }
              if ((pxVar8->flags & 8U) != 0) {
                xmlFatalErr(ctxt,XML_ERR_ENTITY_LOOP,(char *)0x0);
                xmlHaltParser(ctxt);
                return;
              }
              pxVar8->flags = pxVar8->flags | 8;
              xmlExpandPEsInEntityValue(ctxt,buf,pxVar8->content,pxVar8->length,depth + 1);
              *(byte *)&pxVar8->flags = (byte)pxVar8->flags & 0xf7;
              str = local_88;
              pbVar14 = local_68;
            }
            else if (uVar7 == 0x26) {
              if (local_88[1] == 0x23) {
                if (str < local_88) {
                  xmlSBufAddString(buf,str,(int)local_88 - iVar6);
                }
                iVar6 = xmlParseStringCharRef(ctxt,&local_88);
                if (iVar6 == 0) {
                  return;
                }
                xmlSBufAddChar(buf,iVar6);
                str = local_88;
                pbVar14 = local_68;
              }
              else {
                local_88 = local_88 + 1;
                pxVar12 = xmlParseStringName(ctxt,&local_88);
                if ((pxVar12 == (xmlChar *)0x0) ||
                   (pbVar1 = local_88 + 1, bVar2 = *local_88, local_88 = pbVar1, bVar2 != 0x3b)) {
                  xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_ENTITY_CHAR_ERROR,
                             XML_ERR_FATAL,(xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,0,"%s",
                             "EntityValue: \'&\' forbidden except for entities references\n");
                  goto LAB_001320b8;
                }
                (*xmlFree)(pxVar12);
              }
            }
            else {
              if ((bVar2 < 0x20) && ((0xd < uVar7 || ((0x2600U >> (uVar7 & 0x1f) & 1) == 0)))) {
                in_stack_ffffffffffffff68 = (xmlChar *)0x0;
                xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_INVALID_CHAR,XML_ERR_FATAL,
                           (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,0,"%s",
                           "invalid character in entity value\n");
                goto LAB_00131e06;
              }
              local_88 = local_88 + 1;
            }
          }
        } while (local_88 < pbVar14);
        if (str < local_88) {
          xmlSBufAddString(buf,str,(int)local_88 - (int)str);
        }
      }
    }
    else {
      pcVar17 = "Maximum entity nesting depth exceeded";
      code = XML_ERR_RESOURCE_LIMIT;
LAB_00132004:
      xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,code,XML_ERR_FATAL,(xmlChar *)0x0,
                 (xmlChar *)0x0,(xmlChar *)0x0,0,"%s",pcVar17);
    }
  }
  return;
}

Assistant:

static void
xmlExpandPEsInEntityValue(xmlParserCtxtPtr ctxt, xmlSBuf *buf,
                          const xmlChar *str, int length, int depth) {
    int maxDepth = (ctxt->options & XML_PARSE_HUGE) ? 40 : 20;
    const xmlChar *end, *chunk;
    int c, l;

    if (str == NULL)
        return;

    depth += 1;
    if (depth > maxDepth) {
	xmlFatalErrMsg(ctxt, XML_ERR_RESOURCE_LIMIT,
                       "Maximum entity nesting depth exceeded");
	return;
    }

    end = str + length;
    chunk = str;

    while ((str < end) && (!PARSER_STOPPED(ctxt))) {
        c = *str;

        if (c >= 0x80) {
            l = xmlUTF8MultibyteLen(ctxt, str,
                    "invalid character in entity value\n");
            if (l == 0) {
                if (chunk < str)
                    xmlSBufAddString(buf, chunk, str - chunk);
                xmlSBufAddReplChar(buf);
                str += 1;
                chunk = str;
            } else {
                str += l;
            }
        } else if (c == '&') {
            if (str[1] == '#') {
                if (chunk < str)
                    xmlSBufAddString(buf, chunk, str - chunk);

                c = xmlParseStringCharRef(ctxt, &str);
                if (c == 0)
                    return;

                xmlSBufAddChar(buf, c);

                chunk = str;
            } else {
                xmlChar *name;

                /*
                 * General entity references are checked for
                 * syntactic validity.
                 */
                str++;
                name = xmlParseStringName(ctxt, &str);

                if ((name == NULL) || (*str++ != ';')) {
                    xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_CHAR_ERROR,
                            "EntityValue: '&' forbidden except for entities "
                            "references\n");
                    xmlFree(name);
                    return;
                }

                xmlFree(name);
            }
        } else if (c == '%') {
            xmlEntityPtr ent;

            if (chunk < str)
                xmlSBufAddString(buf, chunk, str - chunk);

            ent = xmlParseStringPEReference(ctxt, &str);
            if (ent == NULL)
                return;

            if (!PARSER_EXTERNAL(ctxt)) {
                xmlFatalErr(ctxt, XML_ERR_ENTITY_PE_INTERNAL, NULL);
                return;
            }

            if (ent->content == NULL) {
                /*
                 * Note: external parsed entities will not be loaded,
                 * it is not required for a non-validating parser to
                 * complete external PEReferences coming from the
                 * internal subset
                 */
                if (((ctxt->options & XML_PARSE_NO_XXE) == 0) &&
                    ((ctxt->replaceEntities) ||
                     (ctxt->validate))) {
                    xmlLoadEntityContent(ctxt, ent);
                } else {
                    xmlWarningMsg(ctxt, XML_ERR_ENTITY_PROCESSING,
                                  "not validating will not read content for "
                                  "PE entity %s\n", ent->name, NULL);
                }
            }

            /*
             * TODO: Skip if ent->content is still NULL.
             */

            if (xmlParserEntityCheck(ctxt, ent->length))
                return;

            if (ent->flags & XML_ENT_EXPANDING) {
                xmlFatalErr(ctxt, XML_ERR_ENTITY_LOOP, NULL);
                xmlHaltParser(ctxt);
                return;
            }

            ent->flags |= XML_ENT_EXPANDING;
            xmlExpandPEsInEntityValue(ctxt, buf, ent->content, ent->length,
                                      depth);
            ent->flags &= ~XML_ENT_EXPANDING;

            chunk = str;
        } else {
            /* Normal ASCII char */
            if (!IS_BYTE_CHAR(c)) {
                xmlFatalErrMsg(ctxt, XML_ERR_INVALID_CHAR,
                        "invalid character in entity value\n");
                if (chunk < str)
                    xmlSBufAddString(buf, chunk, str - chunk);
                xmlSBufAddReplChar(buf);
                str += 1;
                chunk = str;
            } else {
                str += 1;
            }
        }
    }

    if (chunk < str)
        xmlSBufAddString(buf, chunk, str - chunk);
}